

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O3

void Omega_h::ghost_mesh(Mesh *mesh,Int nlayers,bool verbose)

{
  int *piVar1;
  void **ppvVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  Alloc *pAVar4;
  Alloc *pAVar5;
  void *pvVar6;
  void *pvVar7;
  Alloc *this;
  Int IVar8;
  uint uVar9;
  LO nrroots;
  undefined8 uVar10;
  char *pcVar11;
  int iVar12;
  bool bVar13;
  bool bVar14;
  Remotes vert_use_owners;
  RemoteGraph own_verts2own_elems;
  Read<long> old_owner_globals;
  Remotes new_use_owners;
  Dist owners2elems;
  Dist elems2owners;
  Dist verts2owners;
  Dist uses2old_owners;
  GOs local_738;
  Remotes local_728;
  RemoteGraph local_700;
  Alloc *local_6d0;
  element_type *local_6c8;
  Remotes local_6c0;
  Remotes local_6a0;
  RemoteGraph local_680;
  Remotes local_650;
  RemoteGraph local_630;
  Alloc *local_600;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5f8;
  Alloc *local_5f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_5e8;
  CommPtr local_5e0;
  Dist local_5d0;
  Dist local_540;
  Dist local_4b0;
  Dist local_420;
  Dist local_390;
  Dist local_300;
  Dist local_270;
  Dist local_1e0;
  Dist local_150;
  Dist local_c0;
  
  IVar8 = Mesh::nghost_layers(mesh);
  if (IVar8 < 0) {
    pcVar11 = "mesh->nghost_layers() >= 0";
    uVar10 = 0x67;
  }
  else {
    IVar8 = Mesh::nghost_layers(mesh);
    if (IVar8 < nlayers) {
      uVar9 = Mesh::nghost_layers(mesh);
      get_own_verts2own_elems(&local_700,mesh);
      Mesh::ask_dist(&local_4b0,mesh,0);
      local_680.locals2edges.write_.shared_alloc_.alloc =
           local_700.locals2edges.write_.shared_alloc_.alloc;
      if (((ulong)local_700.locals2edges.write_.shared_alloc_.alloc & 7) == 0 &&
          local_700.locals2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_680.locals2edges.write_.shared_alloc_.alloc =
               (Alloc *)((local_700.locals2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_700.locals2edges.write_.shared_alloc_.alloc)->use_count =
               (local_700.locals2edges.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_680.locals2edges.write_.shared_alloc_.direct_ptr =
           local_700.locals2edges.write_.shared_alloc_.direct_ptr;
      local_680.edges2remotes.ranks.write_.shared_alloc_.alloc =
           local_700.edges2remotes.ranks.write_.shared_alloc_.alloc;
      if (((ulong)local_700.edges2remotes.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
          local_700.edges2remotes.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_680.edges2remotes.ranks.write_.shared_alloc_.alloc =
               (Alloc *)((local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count =
               (local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_680.edges2remotes.ranks.write_.shared_alloc_.direct_ptr =
           local_700.edges2remotes.ranks.write_.shared_alloc_.direct_ptr;
      local_680.edges2remotes.idxs.write_.shared_alloc_.alloc =
           local_700.edges2remotes.idxs.write_.shared_alloc_.alloc;
      if (((ulong)local_700.edges2remotes.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
          local_700.edges2remotes.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        if (entering_parallel == '\x01') {
          local_680.edges2remotes.idxs.write_.shared_alloc_.alloc =
               (Alloc *)((local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
        }
        else {
          (local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count =
               (local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count + 1;
        }
      }
      local_680.edges2remotes.idxs.write_.shared_alloc_.direct_ptr =
           local_700.edges2remotes.idxs.write_.shared_alloc_.direct_ptr;
      Dist::Dist(&local_300,&local_4b0);
      close_up(&local_540,mesh,&local_680,&local_300);
      Dist::~Dist(&local_300);
      RemoteGraph::~RemoteGraph(&local_680);
      local_728.idxs.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_728.idxs.write_.shared_alloc_.direct_ptr =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_728.ranks.write_.shared_alloc_.alloc = (Alloc *)0x0;
      local_728.ranks.write_.shared_alloc_.direct_ptr =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (1 < (int)(nlayers - uVar9)) {
        if (3 < (uint)mesh->dim_) {
          fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
               "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
               ,0x33);
        }
        form_down_use_owners((Remotes *)&local_5d0,mesh,mesh->dim_,0);
        Remotes::operator=(&local_728,(Remotes *)&local_5d0);
        if (((ulong)local_5d0.roots2items_[0].write_.shared_alloc_.alloc & 7) == 0 &&
            local_5d0.roots2items_[0].write_.shared_alloc_.alloc != (Alloc *)0x0) {
          piVar1 = &(local_5d0.roots2items_[0].write_.shared_alloc_.alloc)->use_count;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            Alloc::~Alloc(local_5d0.roots2items_[0].write_.shared_alloc_.alloc);
            operator_delete(local_5d0.roots2items_[0].write_.shared_alloc_.alloc,0x48);
          }
        }
        if (((ulong)local_5d0.parent_comm_.
                    super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr & 7) == 0
            && local_5d0.parent_comm_.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr != (element_type *)0x0) {
          ppvVar2 = &((local_5d0.parent_comm_.
                       super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     host_srcs_).read_.write_.shared_alloc_.direct_ptr;
          *(int *)ppvVar2 = *(int *)ppvVar2 + -1;
          if (*(int *)ppvVar2 == 0) {
            Alloc::~Alloc((Alloc *)local_5d0.parent_comm_.
                                   super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr);
            operator_delete(local_5d0.parent_comm_.
                            super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                            0x48);
          }
        }
        iVar12 = ~uVar9 + nlayers;
        do {
          pvVar7 = local_728.idxs.write_.shared_alloc_.direct_ptr;
          pvVar6 = local_728.ranks.write_.shared_alloc_.direct_ptr;
          local_600 = local_728.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_728.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_728.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_600 = (Alloc *)((local_728.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_728.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_728.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          pAVar5 = local_600;
          local_5f8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_728.ranks.write_.shared_alloc_.direct_ptr;
          local_5f0 = local_728.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_728.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_728.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_5f0 = (Alloc *)((local_728.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_728.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_728.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          this = local_5f0;
          local_5e8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_728.idxs.write_.shared_alloc_.direct_ptr;
          Dist::Dist(&local_390,&local_540);
          uVar9 = mesh->dim_;
          if (3 < uVar9) {
            fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
                 ,0x33);
          }
          Dist::invert(&local_5d0,&local_390);
          bVar13 = ((ulong)pAVar5 & 7) == 0;
          local_6a0.ranks.write_.shared_alloc_.alloc = pAVar5;
          if (bVar13 && pAVar5 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6a0.ranks.write_.shared_alloc_.alloc = (Alloc *)(pAVar5->size * 8 + 1);
            }
            else {
              pAVar5->use_count = pAVar5->use_count + 1;
            }
          }
          local_6a0.ranks.write_.shared_alloc_.direct_ptr = pvVar6;
          bVar14 = ((ulong)this & 7) == 0;
          local_6a0.idxs.write_.shared_alloc_.alloc = this;
          if (bVar14 && this != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6a0.idxs.write_.shared_alloc_.alloc = (Alloc *)(this->size * 8 + 1);
            }
            else {
              this->use_count = this->use_count + 1;
            }
          }
          local_6a0.idxs.write_.shared_alloc_.direct_ptr = pvVar7;
          Dist::exch(&local_650,&local_5d0,&local_6a0,uVar9 + 1);
          pAVar4 = local_6a0.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_6a0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6a0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_6a0.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6a0.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_6a0.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_6a0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6a0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_6a0.ranks.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6a0.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Mesh::comm(mesh);
          local_6c0.ranks.write_.shared_alloc_.alloc = local_650.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_650.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_650.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6c0.ranks.write_.shared_alloc_.alloc =
                   (Alloc *)((local_650.ranks.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_650.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_650.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_6c0.ranks.write_.shared_alloc_.direct_ptr =
               local_650.ranks.write_.shared_alloc_.direct_ptr;
          local_6c0.idxs.write_.shared_alloc_.alloc = local_650.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_650.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_650.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_6c0.idxs.write_.shared_alloc_.alloc =
                   (Alloc *)((local_650.idxs.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_650.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_650.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_6c0.idxs.write_.shared_alloc_.direct_ptr =
               local_650.idxs.write_.shared_alloc_.direct_ptr;
          nrroots = Mesh::nents(mesh,0);
          Dist::Dist(&local_1e0,&local_5e0,&local_6c0,nrroots);
          pAVar4 = local_6c0.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_6c0.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6c0.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_6c0.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6c0.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_6c0.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_6c0.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_6c0.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     ((long)local_6c0.ranks.write_.shared_alloc_.alloc + 0x30);
            *(int *)&p_Var3->_vptr__Sp_counted_base = *(int *)&p_Var3->_vptr__Sp_counted_base + -1;
            if (*(int *)&p_Var3->_vptr__Sp_counted_base == 0) {
              Alloc::~Alloc(local_6c0.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          if (local_5e0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_5e0.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          Mesh::globals((Mesh *)&local_6d0,(Int)mesh);
          Dist::Dist(&local_270,&local_1e0);
          local_738.write_.shared_alloc_.alloc = local_6d0;
          if (((ulong)local_6d0 & 7) == 0 && local_6d0 != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_738.write_.shared_alloc_.alloc = (Alloc *)(local_6d0->size * 8 + 1);
            }
            else {
              local_6d0->use_count = local_6d0->use_count + 1;
            }
          }
          local_738.write_.shared_alloc_.direct_ptr = local_6c8;
          get_new_copies2old_owners(&local_150,&local_270,&local_738);
          pAVar4 = local_738.write_.shared_alloc_.alloc;
          if (((ulong)local_738.write_.shared_alloc_.alloc & 7) == 0 &&
              local_738.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_738.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_738.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_270);
          pAVar4 = local_6d0;
          if (((ulong)local_6d0 & 7) == 0 && local_6d0 != (Alloc *)0x0) {
            piVar1 = &local_6d0->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_6d0);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_1e0);
          pAVar4 = local_650.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_650.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_650.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_650.idxs.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_650.idxs.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          pAVar4 = local_650.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_650.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_650.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            piVar1 = &(local_650.ranks.write_.shared_alloc_.alloc)->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(local_650.ranks.write_.shared_alloc_.alloc);
              operator_delete(pAVar4,0x48);
            }
          }
          Dist::~Dist(&local_5d0);
          Dist::operator=(&local_4b0,&local_150);
          Dist::~Dist(&local_150);
          Dist::~Dist(&local_390);
          if (bVar14 && this != (Alloc *)0x0) {
            piVar1 = &this->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(this);
              operator_delete(this,0x48);
            }
          }
          if (bVar13 && pAVar5 != (Alloc *)0x0) {
            piVar1 = &pAVar5->use_count;
            *piVar1 = *piVar1 + -1;
            if (*piVar1 == 0) {
              Alloc::~Alloc(pAVar5);
              operator_delete(pAVar5,0x48);
            }
          }
          local_630.locals2edges.write_.shared_alloc_.alloc =
               local_700.locals2edges.write_.shared_alloc_.alloc;
          if (((ulong)local_700.locals2edges.write_.shared_alloc_.alloc & 7) == 0 &&
              local_700.locals2edges.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_630.locals2edges.write_.shared_alloc_.alloc =
                   (Alloc *)((local_700.locals2edges.write_.shared_alloc_.alloc)->size * 8 + 1);
            }
            else {
              (local_700.locals2edges.write_.shared_alloc_.alloc)->use_count =
                   (local_700.locals2edges.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_630.locals2edges.write_.shared_alloc_.direct_ptr =
               local_700.locals2edges.write_.shared_alloc_.direct_ptr;
          local_630.edges2remotes.ranks.write_.shared_alloc_.alloc =
               local_700.edges2remotes.ranks.write_.shared_alloc_.alloc;
          if (((ulong)local_700.edges2remotes.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
              local_700.edges2remotes.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_630.edges2remotes.ranks.write_.shared_alloc_.alloc =
                   (Alloc *)((local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->size * 8 +
                            1);
            }
            else {
              (local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count =
                   (local_700.edges2remotes.ranks.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_630.edges2remotes.ranks.write_.shared_alloc_.direct_ptr =
               local_700.edges2remotes.ranks.write_.shared_alloc_.direct_ptr;
          local_630.edges2remotes.idxs.write_.shared_alloc_.alloc =
               local_700.edges2remotes.idxs.write_.shared_alloc_.alloc;
          if (((ulong)local_700.edges2remotes.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
              local_700.edges2remotes.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
            if (entering_parallel == '\x01') {
              local_630.edges2remotes.idxs.write_.shared_alloc_.alloc =
                   (Alloc *)((local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->size * 8 + 1
                            );
            }
            else {
              (local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count =
                   (local_700.edges2remotes.idxs.write_.shared_alloc_.alloc)->use_count + 1;
            }
          }
          local_630.edges2remotes.idxs.write_.shared_alloc_.direct_ptr =
               local_700.edges2remotes.idxs.write_.shared_alloc_.direct_ptr;
          Dist::Dist(&local_c0,&local_4b0);
          close_up(&local_5d0,mesh,&local_630,&local_c0);
          Dist::operator=(&local_540,&local_5d0);
          Dist::~Dist(&local_5d0);
          Dist::~Dist(&local_c0);
          RemoteGraph::~RemoteGraph(&local_630);
          iVar12 = iVar12 + -1;
        } while (iVar12 != 0);
      }
      Dist::Dist(&local_420,&local_540);
      migrate_mesh(mesh,&local_420,OMEGA_H_GHOSTED,verbose);
      Dist::~Dist(&local_420);
      pAVar5 = local_728.idxs.write_.shared_alloc_.alloc;
      if (((ulong)local_728.idxs.write_.shared_alloc_.alloc & 7) == 0 &&
          local_728.idxs.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_728.idxs.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_728.idxs.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      pAVar5 = local_728.ranks.write_.shared_alloc_.alloc;
      if (((ulong)local_728.ranks.write_.shared_alloc_.alloc & 7) == 0 &&
          local_728.ranks.write_.shared_alloc_.alloc != (Alloc *)0x0) {
        piVar1 = &(local_728.ranks.write_.shared_alloc_.alloc)->use_count;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          Alloc::~Alloc(local_728.ranks.write_.shared_alloc_.alloc);
          operator_delete(pAVar5,0x48);
        }
      }
      Dist::~Dist(&local_540);
      Dist::~Dist(&local_4b0);
      RemoteGraph::~RemoteGraph(&local_700);
      return;
    }
    pcVar11 = "nlayers > mesh->nghost_layers()";
    uVar10 = 0x68;
  }
  fail("assertion %s failed at %s +%d\n",pcVar11,
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_ghost.cpp"
       ,uVar10);
}

Assistant:

void ghost_mesh(Mesh* mesh, Int nlayers, bool verbose) {
  OMEGA_H_CHECK(mesh->nghost_layers() >= 0);
  OMEGA_H_CHECK(nlayers > mesh->nghost_layers());
  auto nnew_layers = nlayers - mesh->nghost_layers();
  auto own_verts2own_elems = get_own_verts2own_elems(mesh);
  auto verts2owners = mesh->ask_dist(VERT);
  auto elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  auto vert_use_owners = Remotes();
  if (nnew_layers > 1) {
    vert_use_owners = form_down_use_owners(mesh, mesh->dim(), VERT);
  }
  for (Int i = 1; i < nnew_layers; ++i) {
    verts2owners = close_down(mesh, vert_use_owners, elems2owners);
    elems2owners = close_up(mesh, own_verts2own_elems, verts2owners);
  }
  migrate_mesh(mesh, elems2owners, OMEGA_H_GHOSTED, verbose);
}